

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent indent)

{
  cmInstalledFile *pcVar1;
  _Base_ptr p_Var2;
  cmCompiledGeneratorExpression *this_00;
  string *psVar3;
  ostream *poVar4;
  string *psVar5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  value_type *j;
  _Base_ptr p_Var8;
  string_view str;
  string_view str_00;
  string_view str_01;
  string value;
  string local_70;
  string local_50;
  
  this_00 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  uVar7 = 0;
  psVar3 = cmCompiledGeneratorExpression::Evaluate
                     (this_00,this->LG,config,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = this->InstalledFile;
  for (p_Var6 = (pcVar1->Properties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(pcVar1->Properties)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"set_property(INSTALL ");
    str._M_str = (char *)0x0;
    str._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_50,(cmOutputConverter *)psVar3->_M_string_length,str,(WrapQuotes)uVar7);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4," PROPERTY ");
    str_00._M_str = (char *)0x0;
    str_00._M_len = *(ulong *)(p_Var6 + 1);
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_70,(cmOutputConverter *)p_Var6[1]._M_parent,str_00,(WrapQuotes)uVar7);
    std::operator<<(poVar4,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    p_Var2 = p_Var6[2]._M_parent;
    for (p_Var8 = *(_Base_ptr *)(p_Var6 + 2); p_Var8 != p_Var2;
        p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      uVar7 = 0;
      psVar5 = cmCompiledGeneratorExpression::Evaluate
                         (*(cmCompiledGeneratorExpression **)p_Var8,this->LG,config,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,&local_70);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_70);
      poVar4 = std::operator<<(os," ");
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)local_50._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_70,(cmOutputConverter *)local_50._M_string_length,str_01,(WrapQuotes)uVar7);
      std::operator<<(poVar4,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator<<(os,")\n");
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string const& expandedFileName =
    this->InstalledFile.GetNameExpression().Evaluate(this->LG, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for (cmInstalledFile::PropertyMapType::value_type const& i : properties) {
    std::string const& name = i.first;
    cmInstalledFile::Property const& property = i.second;

    os << indent << "set_property(INSTALL "
       << cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY "
       << cmOutputConverter::EscapeForCMake(name);

    for (cmInstalledFile::ExpressionVectorType::value_type const& j :
         property.ValueExpressions) {
      std::string value = j->Evaluate(this->LG, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
    }

    os << ")\n";
  }
}